

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Estimators.cc
# Opt level: O2

void __thiscall Estimate::UKF::SigmaPts2Estimate(UKF *this)

{
  int iVar1;
  UKF *pUVar2;
  double *pdVar3;
  double *pdVar4;
  uint uVar5;
  double *pdVar6;
  MatrixXd Xi;
  VectorXd xhat;
  VectorXd w;
  double *local_c8;
  double *local_c0;
  Index IStack_b8;
  MatrixXd *local_b0;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_a8;
  double *local_a0;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_98;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_90;
  undefined8 local_88;
  double *local_80;
  Index local_78;
  UKF *local_68;
  MatrixXd Phat;
  MatrixXd d;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&Xi,
             (DenseStorage<double,__1,__1,__1,_0> *)&this->Xi_);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&w,
             (DenseStorage<double,__1,__1,_1,_0> *)&this->w_);
  iVar1 = this->n_;
  pdVar3 = (double *)(long)iVar1;
  IStack_b8 = 0;
  local_c8 = pdVar3;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xhat,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_c8);
  IStack_b8 = 0;
  local_c8 = pdVar3;
  local_c0 = pdVar3;
  local_68 = this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Phat,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_c8);
  uVar5 = iVar1 * 2 + 1;
  pdVar4 = (double *)0x0;
  pdVar6 = (double *)(ulong)uVar5;
  if ((int)uVar5 < 1) {
    pdVar6 = pdVar4;
  }
  for (; pdVar6 != pdVar4; pdVar4 = (double *)((long)pdVar4 + 1)) {
    local_a8 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
               (Xi.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
               + Xi.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows * (long)pdVar4);
    local_b0 = (MatrixXd *)
               w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               [(long)pdVar4];
    IStack_b8 = 1;
    local_98 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)0x1;
    local_90 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Xi;
    local_88 = 0;
    local_78 = Xi.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_c0 = pdVar3;
    local_a0 = pdVar3;
    local_80 = pdVar4;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xhat,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                *)&local_c8);
  }
  for (pdVar4 = (double *)0x0; pUVar2 = local_68, pdVar6 != pdVar4;
      pdVar4 = (double *)((long)pdVar4 + 1)) {
    local_c8 = Xi.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
               + Xi.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows * (long)pdVar4;
    IStack_b8 = 1;
    local_b0 = &Xi;
    local_a8 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)0x0;
    local_98 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
               Xi.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_c0 = pdVar3;
    local_a0 = pdVar4;
    local_90 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xhat;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&d,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_c8);
    local_b0 = (MatrixXd *)
               w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               [(long)pdVar4];
    local_c0 = (double *)
               d.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    IStack_b8 = d.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
    local_a8 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&d;
    local_98 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&d;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Phat,
               (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                *)&local_c8);
    free(d.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  }
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (&local_68->Phat_,&Phat);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&pUVar2->xhat_,&xhat);
  free(Phat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(xhat.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(Xi.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void UKF::SigmaPts2Estimate(){

		//extract locals
		Eigen::MatrixXd Xi = this->Xi_;
		Eigen::VectorXd w = this->w_;
		int n = this->n_;

		//initialize variables
		Eigen::VectorXd xhat = Eigen::VectorXd::Zero(n);
		Eigen::MatrixXd Phat = Eigen::MatrixXd::Zero(n,n);

		//get estimate
		for (int i = 0; i < (2*n + 1); ++i) {
			xhat += w(i)*Xi.block(0,i,n,1);
		}

		//get covariance
		for (int i = 0; i < (2*n + 1); ++i) {
			Eigen::MatrixXd d = Xi.block(0,i,n,1) - xhat;
			Phat += w(i)*d*d.transpose();
		}

		//assign
		this->Phat_ = Phat;
		this->xhat_ = xhat;


	}